

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeC.cpp
# Opt level: O1

longlong SoapySDR_timeNsToTicks(longlong timeNs,double rate)

{
  longlong lVar1;
  
  lVar1 = llround((rate * (double)(timeNs % 1000000000)) / 1000000000.0 +
                  (rate - (double)(long)rate) * (double)(timeNs / 1000000000));
  return lVar1 + (timeNs / 1000000000) * (long)rate;
}

Assistant:

long long SoapySDR_timeNsToTicks(const long long timeNs, const double rate)
{
    const long long ratell = (long long)(rate);
    const long long full = (long long)(timeNs/1000000000);
    const long long err = timeNs - (full*1000000000);
    const double part = full*(rate - ratell);
    const double frac = part + ((err*rate)/1000000000);
    return (full*ratell) + llround(frac);
}